

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.cpp
# Opt level: O3

void __thiscall Mond::Visitor::Visit(Visitor *this,StmtVarDecl *stmt)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<Mond::Expr> *value;
  pointer psVar3;
  
  (*this->_vptr_Visitor[2])();
  psVar1 = (stmt->values).
           super__Vector_base<std::shared_ptr<Mond::Expr>,_std::allocator<std::shared_ptr<Mond::Expr>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (stmt->values).
                super__Vector_base<std::shared_ptr<Mond::Expr>,_std::allocator<std::shared_ptr<Mond::Expr>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<Mond::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      (*(peVar2->super_AstNode)._vptr_AstNode[2])(peVar2,this);
    }
  }
  return;
}

Assistant:

void Visitor::Visit(StmtVarDecl *stmt)
{
	VisitSelf(this, stmt);

	for (auto &value : stmt->values)
	{
		AcceptChild(this, value.get());
	}
}